

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_fence_all(comex_group_t group)

{
  char *pcVar1;
  int iVar2;
  int *notify;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = 0;
  uVar7 = (ulong)(uint)l_state.size;
  if (l_state.size < 1) {
    uVar7 = uVar5;
  }
  iVar6 = 0;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    iVar6 = (iVar6 + 1) - (uint)(fence_array[uVar5] == '\0');
  }
  if (iVar6 != 0) {
    notify = (int *)_my_malloc(4);
    *notify = iVar6;
    iVar2 = l_state.size;
    for (uVar7 = 0; (long)uVar7 < (long)iVar2; uVar7 = uVar7 + 1) {
      if ((uVar7 != (uint)l_state.rank) && (fence_array[uVar7] != '\0')) {
        _send_fence_message((int)uVar7,notify);
        iVar2 = l_state.size;
      }
    }
    while (pcVar1 = fence_array, 0 < *notify) {
      comex_make_progress();
    }
    iVar4 = 0;
    iVar2 = l_state.size;
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      if (pcVar1[lVar3] != '\0') {
        pcVar1[lVar3] = '\0';
        iVar4 = iVar4 + 1;
        iVar2 = l_state.size;
      }
    }
    if (iVar6 != iVar4) {
      __assert_fail("count_before == count_after",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                    ,0x43c,"int comex_fence_all(comex_group_t)");
    }
    free(notify);
  }
  return 0;
}

Assistant:

int comex_fence_all(comex_group_t group)
{
    int p = 0;
    int count_before = 0;
    int count_after = 0;
    int *notify = NULL;

#if DEBUG
    printf("[%d] comex_fence_all()\n", l_state.rank);
#endif

    /* count how many fence messagse to send */
    for (p=0; p<l_state.size; ++p) {
        if (fence_array[p]) {
            ++count_before;
        }
    }

    /* check for no outstanding put/get requests */
    if (0 == count_before) {
        return COMEX_SUCCESS;
    }

    /* we allocate the notifier on the heap in order to avoid reentry
     * into this function causing the same stack address to be reused */
    notify = _my_malloc(sizeof(int));
    assert(notify);
    *notify = count_before;

    /* optimize by only sending to procs which we have outstanding messages */
    for (p=0; p<l_state.size; ++p) {
        if (p == l_state.rank) {
            continue;
        }
        if (fence_array[p]) {
            _send_fence_message(p, notify);
        }
    }

    while (*notify > 0) {
        comex_make_progress();
#if DEBUG
        printf("[%d] are we stuck? notify=%d\n", l_state.rank, *notify);
#endif
    }

    for (p=0; p<l_state.size; ++p) {
        if (fence_array[p]) {
            fence_array[p] = 0;
            ++count_after;
        }
    }
    assert(count_before == count_after);

    _my_free(notify);

    return COMEX_SUCCESS;
}